

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall minihttp::HttpSocket::_OpenRequest(HttpSocket *this,Request *req)

{
  bool bVar1;
  uint uVar2;
  char *__file;
  Request *req_local;
  HttpSocket *this_local;
  
  if ((this->_inProgress & 1U) == 0) {
    if ((((req->useSSL & 1U) == 0) || (bVar1 = TcpSocket::hasSSL(&this->super_TcpSocket), bVar1)) ||
       (bVar1 = TcpSocket::initSSL(&this->super_TcpSocket,(char *)0x0), bVar1)) {
      __file = (char *)std::__cxx11::string::c_str();
      uVar2 = TcpSocket::open(&this->super_TcpSocket,__file,req->port);
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        this->_inProgress = true;
        Request::operator=(&this->_curRequest,req);
        this->_status = 0;
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HttpSocket::_OpenRequest(const Request& req)
{
    if(_inProgress)
    {
        traceprint("HttpSocket::_OpenRequest(): _inProgress == true, should not be called.");
        return false;
    }
    if(req.useSSL && !hasSSL())
    {
        traceprint("HttpSocket::_OpenRequest(): Is an SSL connection, but SSL was not inited, doing that now\n");
        if(!initSSL(NULL)) // FIXME: supply cert list?
        {
            traceprint("FAILED to init SSL\n");
            return false;
        }
    }
    if(!open(req.host.c_str(), req.port))
        return false;
    _inProgress = true;
    _curRequest = req;
    _status = 0;
    return true;
}